

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtable.c
# Opt level: O3

void objc_send_initialize(id object)

{
  byte *pbVar1;
  Class class;
  unsigned_long uVar2;
  ulong uVar3;
  dtable_t pSVar4;
  dtable_t pSVar5;
  _InitializingDtable *p_Var6;
  id poVar7;
  uintptr_t addr;
  mutex_t *__mutex;
  uint uVar8;
  InitializingDtable meta_buffer;
  InitializingDtable buffer;
  
  poVar7 = object;
  if (((ulong)object & 7) != 0) {
    poVar7 = (id)((long)SmallObjectClasses + (ulong)(uint)((int)((ulong)object & 7) << 3));
  }
  if ((poVar7->isa->info & 1) == 0) {
    object = (id)poVar7->isa;
  }
  class = ((Class)object)->isa;
  objc_resolve_class((Class)object);
  if (((Class)object)->super_class != (Class)0x0) {
    objc_send_initialize((id)((Class)object)->super_class);
  }
  pthread_mutex_lock((pthread_mutex_t *)&runtime_mutex);
  uVar2 = ((Class)object)->info;
  pthread_mutex_unlock((pthread_mutex_t *)&runtime_mutex);
  if (((uint)uVar2 >> 8 & 1) == 0) {
    objc_sync_enter((id_conflict)class);
    pthread_mutex_lock((pthread_mutex_t *)&runtime_mutex);
    pthread_mutex_lock((pthread_mutex_t *)&initialize_lock);
    uVar3 = ((Class)object)->info;
    if (((uint)uVar3 >> 8 & 1) == 0) {
      uVar8 = (uint)class->info;
      if ((uVar8 >> 8 & 1) == 0) {
        class->info = class->info | 0x4000;
        uVar3 = ((Class)object)->info;
      }
      ((Class)object)->info = uVar3 | 0x100;
      pbVar1 = (byte *)((long)&class->info + 1);
      *pbVar1 = *pbVar1 | 1;
      pSVar4 = create_dtable_for_class((Class)object,uninstalled_dtable);
      if ((uVar8 >> 8 & 1) == 0) {
        pSVar5 = create_dtable_for_class(class,pSVar4);
      }
      else {
        pSVar5 = (dtable_t)0x0;
      }
      pthread_mutex_unlock((pthread_mutex_t *)&runtime_mutex);
      if (objc_send_initialize::initializeSel == (SEL)0x0) {
        objc_send_initialize::initializeSel = sel_registerName("initialize");
      }
      if ((uVar8 >> 8 & 1) == 0) {
        (*(code *)(&DAT_0011f600 +
                  *(int *)(&DAT_0011f600 + (ulong)(pSVar5->shift << 0x1d | pSVar5->shift >> 3) * 4))
        )(&DAT_0011f600 +
          *(int *)(&DAT_0011f600 + (ulong)(pSVar5->shift << 0x1d | pSVar5->shift >> 3) * 4),pSVar5,
          pSVar5,pSVar5);
        return;
      }
      ((Class)object)->dtable = pSVar4;
      checkARCAccessors((Class)object);
      __mutex = &initialize_lock;
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)&initialize_lock);
      __mutex = &runtime_mutex;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    objc_sync_exit((id_conflict)class);
  }
  else {
    objc_sync_enter((id_conflict)class);
    objc_sync_exit((id_conflict)class);
    pSVar4 = (dtable_t)((Class)object)->dtable;
    if (uninstalled_dtable == pSVar4) {
      pthread_mutex_lock((pthread_mutex_t *)&initialize_lock);
      pSVar5 = (dtable_t)((Class)object)->dtable;
      p_Var6 = temporary_dtables;
      if (uninstalled_dtable == pSVar5) {
        for (; p_Var6 != (InitializingDtable *)0x0; p_Var6 = p_Var6->next) {
          if (p_Var6->class == (Class)object) {
            pSVar4 = p_Var6->dtable;
            break;
          }
        }
        pthread_mutex_unlock((pthread_mutex_t *)&initialize_lock);
        if (pSVar4 != uninstalled_dtable) {
          objc_sync_enter((id_conflict)object);
          objc_sync_exit((id_conflict)object);
        }
      }
      else {
        pthread_mutex_unlock((pthread_mutex_t *)&initialize_lock);
        pSVar4 = pSVar5;
      }
    }
    if (pSVar4 == uninstalled_dtable) {
      __assert_fail("dtable_for_class(class) != uninstalled_dtable",
                    "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/dtable.c",
                    0x301,"void objc_send_initialize(id)");
    }
  }
  return;
}

Assistant:

OBJC_PUBLIC void objc_send_initialize(id object)
{
	Class class = classForObject(object);
	// If the first message is sent to an instance (weird, but possible and
	// likely for things like NSConstantString, make sure +initialize goes to
	// the class not the metaclass.  
	if (objc_test_class_flag(class, objc_class_flag_meta))
	{
		class = (Class)object;
	}
	Class meta = class->isa;


	// Make sure that the class is resolved.
	objc_resolve_class(class);

	// Make sure that the superclass is initialized first.
	if (Nil != class->super_class)
	{
		objc_send_initialize((id)class->super_class);
	}

	// Lock the runtime while we're creating dtables and before we acquire the
	// init lock.  This prevents a lock-order reversal when dtable_for_class is
	// called from something holding the runtime lock while we're still holding
	// the initialize lock.  We should ensure that we never acquire the runtime
	// lock after acquiring the initialize lock.
	LOCK_RUNTIME();

	// Superclass +initialize might possibly send a message to this class, in
	// which case this method would be called again.  See NSObject and
	// NSAutoreleasePool +initialize interaction in GNUstep.
	if (objc_test_class_flag(class, objc_class_flag_initialized))
	{
		// We know that initialization has started because the flag is set.
		// Check that it's finished by grabbing the class lock.  This will be
		// released once the class has been fully initialized. The runtime
		// lock needs to be released first to prevent a deadlock between the
		// runtime lock and the class-specific lock.
		UNLOCK_RUNTIME();

		objc_sync_enter((id)meta);
		objc_sync_exit((id)meta);
		assert(dtable_for_class(class) != uninstalled_dtable);
		return;
	}

	// We should try to acquire the class lock before any runtime/init locks.
	// If another thread is in the middle of running `allocateHiddenClass()` it 
	// has acquired a spinlock and will be trying to acquire the runtime lock. 
	// When this happens there is a small chance we could hit the same spinlock
	// and deadlock the process (as any further attempts to acquire the runtime 
	// will also block forever).
	UNLOCK_RUNTIME();

	LOCK_OBJECT_FOR_SCOPE((id)meta);
	LOCK_RUNTIME();
	LOCK(&initialize_lock);
	if (objc_test_class_flag(class, objc_class_flag_initialized))
	{
		UNLOCK(&initialize_lock);
		UNLOCK_RUNTIME();
		return;
	}
	BOOL skipMeta = objc_test_class_flag(meta, objc_class_flag_initialized);
	// Mark metaclasses as never needing refcount manipulation for their
	// instances (classes).
	if (!skipMeta)
	{
		objc_set_class_flag(meta, objc_class_flag_permanent_instances);
	}

	// Set the initialized flag on both this class and its metaclass, to make
	// sure that +initialize is only ever sent once.
	objc_set_class_flag(class, objc_class_flag_initialized);
	objc_set_class_flag(meta, objc_class_flag_initialized);

	dtable_t class_dtable = create_dtable_for_class(class, uninstalled_dtable);
	dtable_t dtable = skipMeta ? 0 : create_dtable_for_class(meta, class_dtable);
	// Now we've finished doing things that may acquire the runtime lock, so we
	// can hold onto the initialise lock to make anything doing
	// dtable_for_class block until we've finished updating temporary dtable
	// lists.
	// If another thread holds the runtime lock, it can now proceed until it
	// gets into a dtable_for_class call, and then block there waiting for us
	// to finish setting up the temporary dtable.
	UNLOCK_RUNTIME();

	static SEL initializeSel = 0;
	if (0 == initializeSel)
	{
		initializeSel = sel_registerName("initialize");
	}

	struct objc_method *initializeSlot = skipMeta ? 0 :
			objc_dtable_lookup(dtable, initializeSel->index);

	// If there's no initialize method, then don't bother installing and
	// removing the initialize dtable, just install both dtables correctly now
	if (0 == initializeSlot)
	{
		if (!skipMeta)
		{
			meta->dtable = dtable;
		}
		class->dtable = class_dtable;
		checkARCAccessors(class);
		UNLOCK(&initialize_lock);
		return;
	}



	// Create an entry in the dtable look-aside buffer for this.  When sending
	// a message to this class in future, the lookup function will check this
	// buffer if the receiver's dtable is not installed, and block if
	// attempting to send a message to this class.
	InitializingDtable buffer = { class, class_dtable, temporary_dtables };
	__attribute__((cleanup(remove_dtable)))
	InitializingDtable meta_buffer = { meta, dtable, &buffer };
	temporary_dtables = &meta_buffer;
	// We now release the initialize lock.  We'll reacquire it later when we do
	// the cleanup, but at this point we allow other threads to get the
	// temporary dtable and call +initialize in other threads.
	UNLOCK(&initialize_lock);
	// We still hold the class lock at this point.  dtable_for_class will block
	// there after acquiring the temporary dtable.

	checkARCAccessors(class);

	// Store the buffer in the temporary dtables list.  Note that it is safe to
	// insert it into a global list, even though it's a temporary variable,
	// because we will clean it up after this function.
	initializeSlot->imp((id)class, initializeSel);
}